

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenStringEscapeCode(Lexer *this)

{
  int iVar1;
  uint uVar2;
  Lexer *in_RSI;
  size_t sVar3;
  Error<pfederc::LexerErrorCode> *local_40;
  Position local_38;
  
  nextChar(in_RSI);
  uVar2 = in_RSI->currentChar - 0x61;
  if (uVar2 < 0x18) {
    if ((0x2a2023U >> (uVar2 & 0x1f) & 1) != 0) goto LAB_0010a81a;
    if (uVar2 == 0x17) {
      nextChar(in_RSI);
      iVar1 = isxdigit(in_RSI->currentChar);
      if (iVar1 == 0) {
        getCurrentCursor(&local_38,in_RSI);
        sVar3 = in_RSI->currentEndIndex;
        local_40 = (Error<pfederc::LexerErrorCode> *)operator_new(0x38);
      }
      else {
        nextChar(in_RSI);
        iVar1 = isxdigit(in_RSI->currentChar);
        if (iVar1 != 0) goto LAB_0010a81a;
        getCurrentCursor(&local_38,in_RSI);
        sVar3 = in_RSI->currentEndIndex;
        local_40 = (Error<pfederc::LexerErrorCode> *)operator_new(0x38);
      }
      local_40->logLevel = LVL_ERROR;
      local_40->err = LEX_ERR_STR_HEXADECIMAL_CHAR;
      (local_40->pos).line = local_38.line;
      (local_40->pos).startIndex = sVar3;
      (local_40->pos).endIndex = sVar3;
      goto LAB_0010a8a3;
    }
  }
  uVar2 = in_RSI->currentChar - 0x22;
  if ((0x3a < uVar2) || ((0x400000000000021U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
    getCurrentCursor(&local_38,in_RSI);
    local_40 = (Error<pfederc::LexerErrorCode> *)operator_new(0x38);
    local_40->logLevel = LVL_ERROR;
    local_40->err = LEX_ERR_STR_INVALID_ESCAPE_CODE;
    (local_40->pos).line = local_38.line;
    (local_40->pos).startIndex = local_38.startIndex;
    (local_40->pos).endIndex = local_38.endIndex;
LAB_0010a8a3:
    (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)in_RSI);
    if (local_40 != (Error<pfederc::LexerErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::LexerErrorCode>_> *)&local_40,local_40);
    }
    return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
           (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
  }
LAB_0010a81a:
  this->_vptr_Lexer = (_func_int **)0x0;
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenStringEscapeCode() noexcept {
  nextChar(); // eat '\'
  switch (currentChar) {
  case '\'':
  case '\"':
  case '\\':
  case 'a':
  case 'b':
  case 'f':
  case 'n':
  case 'r':
  case 't':
  case 'v':
    return nullptr;
  case 'x':
    nextChar(); // eat x
    if (!std::isxdigit(currentChar)) {
      return generateError(std::make_unique<LexerError>(LVL_ERROR,
        LexerErrorCode::LEX_ERR_STR_HEXADECIMAL_CHAR, Position{getCurrentCursor().line,
          currentEndIndex, currentEndIndex}));
    }
    nextChar(); // eat hex
    if (!std::isxdigit(currentChar)) {
      return generateError(std::make_unique<LexerError>(LVL_ERROR,
        LexerErrorCode::LEX_ERR_STR_HEXADECIMAL_CHAR, Position{getCurrentCursor().line,
          currentEndIndex, currentEndIndex}));
    }
    return nullptr;
  default:
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_STR_INVALID_ESCAPE_CODE, getCurrentCursor()));
  }
}